

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

bool __thiscall
EthBasePort::WriteQuadletNode
          (EthBasePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t data,uchar flags)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  byte local_75;
  uint packetSize;
  uchar *packet;
  allocator<char> local_51;
  string local_50 [35];
  byte local_2d;
  quadlet_t local_2c;
  uchar flags_local;
  nodeaddr_t nStack_28;
  quadlet_t data_local;
  nodeaddr_t addr_local;
  EthBasePort *pEStack_18;
  nodeid_t node_local;
  EthBasePort *this_local;
  
  local_75 = 0;
  local_2d = flags;
  local_2c = data;
  nStack_28 = addr;
  addr_local._6_2_ = node;
  pEStack_18 = this;
  if (node != 0x3f) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_50,"WriteQuadlet",&local_51);
    iVar1 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,local_50,0);
    local_75 = (byte)iVar1 ^ 0xff;
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  if ((local_75 & 1) == 0) {
    BasePort::SetGenericBuffer(&this->super_BasePort);
    puVar4 = (this->super_BasePort).GenericBuffer;
    uVar2 = (*(this->super_BasePort)._vptr_BasePort[0x17])();
    puVar4 = puVar4 + uVar2;
    iVar1 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
    uVar2 = iVar1 + 0x14;
    this->fw_tl = this->fw_tl + 1 & 0x3f;
    (*(this->super_BasePort)._vptr_BasePort[0x31])
              (this,puVar4,(ulong)uVar2,(ulong)addr_local._6_2_,(ulong)local_2d);
    make_write_header(this,puVar4,uVar2,local_2d);
    uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
    make_qwrite_packet(this,(quadlet_t *)(puVar4 + uVar3),addr_local._6_2_,nStack_28,local_2c,
                       (uint)this->fw_tl);
    iVar1 = (*(this->super_BasePort)._vptr_BasePort[0x2d])
                      (this,(ulong)addr_local._6_2_,puVar4,(ulong)uVar2,
                       (ulong)((local_2d & 0x80) != 0));
    this_local._7_1_ = (bool)((byte)iVar1 & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool EthBasePort::WriteQuadletNode(nodeid_t node, nodeaddr_t addr, quadlet_t data, unsigned char flags)
{
    if ((node != FW_NODE_BROADCAST) && !CheckFwBusGeneration("WriteQuadlet"))
        return false;

    // Use GenericBuffer, which is much larger than needed
    SetGenericBuffer();   // Make sure buffer is allocated
    unsigned char *packet = GenericBuffer+GetWriteQuadAlign();
    unsigned int packetSize = GetPrefixOffset(WR_FW_HEADER)+FW_QWRITE_SIZE;

    // Increment transaction label
    fw_tl = (fw_tl+1)&FW_TL_MASK;

    // Make Ethernet header (only needed for raw Ethernet)
    make_ethernet_header(packet, packetSize, node, flags);

    // Make control word
    make_write_header(packet, packetSize, flags);

    // Build FireWire packet (also byteswaps data)
    make_qwrite_packet(reinterpret_cast<quadlet_t *>(packet+GetPrefixOffset(WR_FW_HEADER)), node, addr, data, fw_tl);

    return PacketSend(node, packet, packetSize, flags&FW_NODE_ETH_BROADCAST_MASK);
}